

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 SyStrToInt32(char *zSrc,sxu32 nLen,void *pOutVal,char **zRest)

{
  char cVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  ushort **ppuVar5;
  short sVar7;
  char *pcVar8;
  char *pcVar9;
  short sVar10;
  long lVar11;
  char *pcVar12;
  char *pcVar13;
  int iVar14;
  bool bVar15;
  ushort *puVar6;
  
  pcVar13 = zSrc + nLen;
  bVar15 = false;
  if (nLen != 0) {
    ppuVar5 = __ctype_b_loc();
    do {
      cVar1 = *zSrc;
      if ((*(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1) & 0x20) == 0) {
        if ((cVar1 == '+') || (cVar1 == '-')) {
          bVar15 = cVar1 == '-';
          goto LAB_00122363;
        }
        break;
      }
      zSrc = zSrc + 1;
    } while (zSrc < pcVar13);
  }
  for (; (zSrc < pcVar13 && (*zSrc == '0')); zSrc = zSrc + 1) {
LAB_00122363:
  }
  uVar3 = (int)pcVar13 - (int)zSrc;
  sVar7 = 10;
  if (9 < uVar3) {
    pcVar9 = "2147483648";
    if (!bVar15) {
      pcVar9 = "2147483647";
    }
    uVar3 = SyMemcmp(zSrc,pcVar9,nLen);
    sVar7 = ((int)uVar3 < 1) + 9;
  }
  puVar6 = (ushort *)(ulong)uVar3;
  iVar14 = 0;
  pcVar9 = zSrc;
  if (zSrc < pcVar13) {
    ppuVar5 = __ctype_b_loc();
    puVar6 = *ppuVar5;
    lVar11 = 0;
    iVar14 = 0;
    pcVar12 = zSrc;
    do {
      if ((*(byte *)((long)puVar6 + (long)zSrc[lVar11] * 2 + 1) & 8) == 0) {
        pcVar9 = zSrc + lVar11;
        goto LAB_001224d4;
      }
      iVar14 = (int)zSrc[lVar11] + iVar14 * 10 + -0x30;
      pcVar8 = zSrc + lVar11 + 1;
      pcVar9 = pcVar12 + 1;
      if (((pcVar13 <= pcVar8) || (sVar10 = (short)lVar11, (short)(sVar7 + -1) == sVar10)) ||
         (pcVar9 = pcVar8, (*(byte *)((long)puVar6 + (long)*pcVar8 * 2 + 1) & 8) == 0))
      goto LAB_001224d4;
      iVar14 = (int)*pcVar8 + iVar14 * 10 + -0x30;
      pcVar9 = zSrc + lVar11 + 2;
      if ((pcVar13 <= pcVar9) || ((short)(sVar7 + -2) == sVar10)) goto LAB_001224d4;
      if ((*(byte *)((long)puVar6 + (long)*pcVar9 * 2 + 1) & 8) == 0) {
        pcVar9 = pcVar12 + 2;
        goto LAB_001224d4;
      }
      iVar14 = (int)*pcVar9 + iVar14 * 10 + -0x30;
      pcVar8 = zSrc + lVar11 + 3;
      pcVar9 = pcVar12 + 3;
      if (((pcVar13 <= pcVar8) || ((short)(sVar7 + -3) == sVar10)) ||
         (pcVar9 = pcVar8, (*(byte *)((long)puVar6 + (long)*pcVar8 * 2 + 1) & 8) == 0))
      goto LAB_001224d4;
      iVar14 = (int)*pcVar8 + iVar14 * 10 + -0x30;
      lVar2 = lVar11 + 4;
      lVar11 = lVar11 + 4;
    } while ((zSrc + lVar2 < pcVar13) && (pcVar12 = pcVar12 + 4, (short)(sVar7 + -4) != sVar10));
    pcVar9 = zSrc + lVar11;
  }
LAB_001224d4:
  if (pcVar9 < pcVar13) {
    ppuVar5 = __ctype_b_loc();
    puVar6 = *ppuVar5;
    do {
      pcVar12 = pcVar9 + 1;
      if ((*(byte *)((long)puVar6 + (long)*pcVar9 * 2 + 1) & 0x20) == 0) break;
      pcVar9 = pcVar12;
    } while (pcVar12 < pcVar13);
  }
  iVar4 = (int)puVar6;
  if (pOutVal != (void *)0x0) {
    iVar4 = -iVar14;
    if (iVar14 == 0) {
      iVar4 = iVar14;
    }
    if (!bVar15) {
      iVar4 = iVar14;
    }
    *(int *)pOutVal = iVar4;
  }
  return iVar4;
}

Assistant:

JX9_PRIVATE sxi32 SyStrToInt32(const char *zSrc, sxu32 nLen, void * pOutVal, const char **zRest)
{
	int isNeg = FALSE;
	const char *zEnd;
	sxi32 nVal = 0;
	sxi16 i;
#if defined(UNTRUST)
	if( SX_EMPTY_STR(zSrc) ){
		if( pOutVal ){
			*(sxi32 *)pOutVal = 0;
		}
		return SXERR_EMPTY;
	}
#endif
	zEnd = &zSrc[nLen];
	while(zSrc < zEnd && SyisSpace(zSrc[0]) ){
		zSrc++;
	}
	if( zSrc < zEnd && ( zSrc[0] == '-' || zSrc[0] == '+' ) ){
		isNeg = (zSrc[0] == '-') ? TRUE :FALSE;
		zSrc++;
	}
	/* Skip leading zero */
	while(zSrc < zEnd && zSrc[0] == '0' ){
		zSrc++; 
	}
	i = 10;
	if( (sxu32)(zEnd-zSrc) >= 10 ){
		/* Handle overflow */
		i = SyMemcmp(zSrc, (isNeg == TRUE) ? SXINT32_MIN_STR : SXINT32_MAX_STR, nLen) <= 0 ? 10 : 9; 
	}
	for(;;){
		if(zSrc >= zEnd || !i || !SyisDigit(zSrc[0])){ break; } nVal = nVal * 10 + ( zSrc[0] - '0' ) ; --i ; zSrc++;
		if(zSrc >= zEnd || !i || !SyisDigit(zSrc[0])){ break; } nVal = nVal * 10 + ( zSrc[0] - '0' ) ; --i ; zSrc++;
		if(zSrc >= zEnd || !i || !SyisDigit(zSrc[0])){ break; } nVal = nVal * 10 + ( zSrc[0] - '0' ) ; --i ; zSrc++;
		if(zSrc >= zEnd || !i || !SyisDigit(zSrc[0])){ break; } nVal = nVal * 10 + ( zSrc[0] - '0' ) ; --i ; zSrc++;
	}
	/* Skip trailing spaces */
	while(zSrc < zEnd && SyisSpace(zSrc[0])){
		zSrc++;
	}
	if( zRest ){
		*zRest = (char *)zSrc;
	}	
	if( pOutVal ){
		if( isNeg == TRUE && nVal != 0 ){
			nVal = -nVal;
		}
		*(sxi32 *)pOutVal = nVal;
	}
	return (zSrc >= zEnd) ? SXRET_OK : SXERR_SYNTAX;
}